

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitruntime.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  Error EVar1;
  size_t size;
  void *rx;
  CodeHolder *pCVar2;
  JitAllocator *this_00;
  size_t codeSize;
  Span span;
  CodeHolder *local_68;
  size_t local_60;
  Span local_58;
  undefined1 *local_30;
  size_t *local_28;
  
  *dst = (void *)0x0;
  local_68 = code;
  EVar1 = CodeHolder::flatten(code);
  if ((EVar1 == 0) && (EVar1 = CodeHolder::resolveUnresolvedLinks(local_68), EVar1 == 0)) {
    size = CodeHolder::codeSize(local_68);
    if (size == 0) {
      EVar1 = 10;
    }
    else {
      local_58._size = 0;
      local_58._block = (void *)0x0;
      local_58._rx = (void *)0x0;
      local_58._rw = (void *)0x0;
      local_58._flags = kNone;
      local_58._reserved = 0;
      this_00 = &this->_allocator;
      EVar1 = JitAllocator::alloc(this_00,&local_58,size);
      if (EVar1 == 0) {
        rx = local_58._rx;
        EVar1 = CodeHolder::relocateToBase(local_68,(uint64_t)local_58._rx);
        if (EVar1 == 0) {
          pCVar2 = local_68;
          local_60 = CodeHolder::codeSize(local_68);
          if (size < local_60) {
            _add();
            EVar1 = JitAllocator::release((JitAllocator *)&pCVar2->_logger,rx);
            return EVar1;
          }
          local_28 = &local_60;
          EVar1 = 0;
          local_30 = (undefined1 *)&local_68;
          JitAllocator::write(this_00,(int)&local_58,
                              JitAllocator::
                              write<asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0>(asmjit::v1_14::JitAllocator::Span&,asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0&&,asmjit::v1_14::VirtMem::CachePolicy)
                              ::{lambda(asmjit::v1_14::JitAllocator::Span&,void*)#1}::Span__void__,
                              (size_t)&local_30);
          *dst = local_58._rx;
        }
        else {
          JitAllocator::release(this_00,local_58._rx);
        }
      }
    }
  }
  return EVar1;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  *dst = nullptr;

  ASMJIT_PROPAGATE(code->flatten());
  ASMJIT_PROPAGATE(code->resolveUnresolvedLinks());

  size_t estimatedCodeSize = code->codeSize();
  if (ASMJIT_UNLIKELY(estimatedCodeSize == 0))
    return DebugUtils::errored(kErrorNoCodeGenerated);

  JitAllocator::Span span;
  ASMJIT_PROPAGATE(_allocator.alloc(span, estimatedCodeSize));

  // Relocate the code.
  Error err = code->relocateToBase(uintptr_t(span.rx()));
  if (ASMJIT_UNLIKELY(err)) {
    _allocator.release(span.rx());
    return err;
  }

  // Recalculate the final code size and shrink the memory we allocated for it
  // in case that some relocations didn't require records in an address table.
  size_t codeSize = code->codeSize();
  ASMJIT_ASSERT(codeSize <= estimatedCodeSize);

  _allocator.write(span, [&](JitAllocator::Span& span) noexcept -> Error {
    uint8_t* rw = static_cast<uint8_t*>(span.rw());

    for (Section* section : code->_sections) {
      size_t offset = size_t(section->offset());
      size_t bufferSize = size_t(section->bufferSize());
      size_t virtualSize = size_t(section->virtualSize());

      ASMJIT_ASSERT(offset + bufferSize <= span.size());
      memcpy(rw + offset, section->data(), bufferSize);

      if (virtualSize > bufferSize) {
        ASMJIT_ASSERT(offset + virtualSize <= span.size());
        memset(rw + offset + bufferSize, 0, virtualSize - bufferSize);
      }
    }

    span.shrink(codeSize);
    return kErrorOk;
  });

  *dst = span.rx();
  return kErrorOk;
}